

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trace.cpp
# Opt level: O2

void __thiscall MppTraceService::MppTraceService(MppTraceService *this)

{
  char *__name;
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x18) {
      return;
    }
    __name = *(char **)((long)MppTraceService::ftrace_paths + lVar2);
    iVar1 = access(__name,0);
    if (iVar1 == 0) {
      iVar1 = open(__name,0x80001);
      this->mTraceFd = iVar1;
      if (-1 < iVar1) {
        return;
      }
    }
    lVar2 = lVar2 + 8;
  } while( true );
}

Assistant:

MppTraceService::MppTraceService()
{
    static const char *ftrace_paths[] = {
        "/sys/kernel/debug/tracing/trace_marker",
        "/debug/tracing/trace_marker",
        "/debugfs/tracing/trace_marker",
    };

    RK_U32 i;

    for (i = 0; i < MPP_ARRAY_ELEMS(ftrace_paths); i++) {
        if (!access(ftrace_paths[i], F_OK)) {
            mTraceFd = open(ftrace_paths[i], O_WRONLY | O_CLOEXEC);
            if (mTraceFd >= 0)
                break;
        }
    }
}